

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O2

int glfwGetWindowAttrib(GLFWwindow *handle,int attrib)

{
  int iVar1;
  
  if (handle == (GLFWwindow *)0x0) {
    __assert_fail("window != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/src/window.c"
                  ,0x2c9,"int glfwGetWindowAttrib(GLFWwindow *, int)");
  }
  if (_glfw.initialized == 0) {
    iVar1 = 0;
    _glfwInputError(0x10001,(char *)0x0);
  }
  else {
    switch(attrib) {
    case 0x22001:
      iVar1 = *(int *)(handle + 0x1f0);
      break;
    case 0x22002:
      iVar1 = *(int *)(handle + 0x1f8);
      break;
    case 0x22003:
      iVar1 = *(int *)(handle + 0x1fc);
      break;
    case 0x22004:
      iVar1 = *(int *)(handle + 0x200);
      break;
    case 0x22005:
      iVar1 = *(int *)(handle + 0x214);
      break;
    case 0x22006:
      iVar1 = *(int *)(handle + 0x204);
      break;
    case 0x22007:
      iVar1 = *(int *)(handle + 0x208);
      break;
    case 0x22008:
      iVar1 = *(int *)(handle + 0x210);
      break;
    case 0x22009:
      iVar1 = *(int *)(handle + 0x218);
      break;
    case 0x2200a:
      iVar1 = *(int *)(handle + 0x20c);
      break;
    case 0x2200b:
      iVar1 = *(int *)(handle + 500);
      break;
    default:
      switch(attrib) {
      case 0x20001:
        iVar1 = _glfwPlatformWindowFocused((_GLFWwindow *)handle);
        return iVar1;
      case 0x20002:
        iVar1 = _glfwPlatformWindowIconified((_GLFWwindow *)handle);
        return iVar1;
      case 0x20003:
        iVar1 = *(int *)(handle + 8);
        break;
      case 0x20004:
        iVar1 = _glfwPlatformWindowVisible((_GLFWwindow *)handle);
        return iVar1;
      case 0x20005:
        iVar1 = *(int *)(handle + 0xc);
        break;
      case 0x20006:
        iVar1 = *(int *)(handle + 0x10);
        break;
      case 0x20007:
        iVar1 = *(int *)(handle + 0x14);
        break;
      case 0x20008:
        iVar1 = _glfwPlatformWindowMaximized((_GLFWwindow *)handle);
        return iVar1;
      default:
        iVar1 = 0;
        _glfwInputError(0x10003,"Invalid window attribute %i");
      }
    }
  }
  return iVar1;
}

Assistant:

GLFWAPI int glfwGetWindowAttrib(GLFWwindow* handle, int attrib)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);

    _GLFW_REQUIRE_INIT_OR_RETURN(0);

    switch (attrib)
    {
        case GLFW_FOCUSED:
            return _glfwPlatformWindowFocused(window);
        case GLFW_ICONIFIED:
            return _glfwPlatformWindowIconified(window);
        case GLFW_VISIBLE:
            return _glfwPlatformWindowVisible(window);
        case GLFW_MAXIMIZED:
            return _glfwPlatformWindowMaximized(window);
        case GLFW_RESIZABLE:
            return window->resizable;
        case GLFW_DECORATED:
            return window->decorated;
        case GLFW_FLOATING:
            return window->floating;
        case GLFW_AUTO_ICONIFY:
            return window->autoIconify;
        case GLFW_CLIENT_API:
            return window->context.client;
        case GLFW_CONTEXT_CREATION_API:
            return window->context.source;
        case GLFW_CONTEXT_VERSION_MAJOR:
            return window->context.major;
        case GLFW_CONTEXT_VERSION_MINOR:
            return window->context.minor;
        case GLFW_CONTEXT_REVISION:
            return window->context.revision;
        case GLFW_CONTEXT_ROBUSTNESS:
            return window->context.robustness;
        case GLFW_OPENGL_FORWARD_COMPAT:
            return window->context.forward;
        case GLFW_OPENGL_DEBUG_CONTEXT:
            return window->context.debug;
        case GLFW_OPENGL_PROFILE:
            return window->context.profile;
        case GLFW_CONTEXT_RELEASE_BEHAVIOR:
            return window->context.release;
        case GLFW_CONTEXT_NO_ERROR:
            return window->context.noerror;
    }

    _glfwInputError(GLFW_INVALID_ENUM, "Invalid window attribute %i", attrib);
    return 0;
}